

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D2xNvmFlash.cpp
# Opt level: O2

void __thiscall D2xNvmFlash::writePage(D2xNvmFlash *this,uint32_t page)

{
  WordCopyApplet *this_00;
  bool *pbVar1;
  uint32_t uVar2;
  undefined8 *puVar3;
  
  if (page < (this->super_Flash)._pages) {
    uVar2 = readReg(this,'\x04');
    writeReg(this,'\x04',uVar2 | 0x40080);
    if (((page & 3) == 0) && ((this->super_Flash).field_0xf4 != '\0')) {
      uVar2 = (this->super_Flash)._size;
      erase(this,uVar2 * page,uVar2 << 2);
    }
    command(this,'D');
    uVar2 = page * (this->super_Flash)._size + (this->super_Flash)._addr;
    this_00 = &(this->super_Flash)._wordCopy;
    WordCopyApplet::setDstAddr(this_00,uVar2);
    WordCopyApplet::setSrcAddr
              (this_00,(&(this->super_Flash)._pageBufferA)[(this->super_Flash)._onBufferA ^ 1]);
    pbVar1 = &(this->super_Flash)._onBufferA;
    *pbVar1 = (bool)(*pbVar1 ^ 1);
    waitReady(this);
    Applet::runv(&this_00->super_Applet);
    writeReg(this,'\x1c',uVar2 >> 1);
    command(this,'\x04');
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_001177a0;
  __cxa_throw(puVar3,&FlashPageError::typeinfo,std::exception::~exception);
}

Assistant:

void
D2xNvmFlash::writePage(uint32_t page)
{
    if (page >= _pages)
    {
        throw FlashPageError();
    }

    // Disable cache and configure manual page write
    writeReg(NVM_REG_CTRLB, readReg(NVM_REG_CTRLB) | (0x1 << 18) | (0x1 << 7));

    // Auto-erase if writing at the start of the erase page
    if (_eraseAuto && page % ERASE_ROW_PAGES == 0)
        erase(page * _size, ERASE_ROW_PAGES * _size);

    // Clear page buffer
    command(NVM_CMD_PBC);

    // Compute the start address.
    uint32_t addr = _addr + (page * _size);

    _wordCopy.setDstAddr(addr);
    _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
    _onBufferA = !_onBufferA;
    waitReady();
    _wordCopy.runv();

    writeReg(NVM_REG_ADDR, addr / 2);
    command(NVM_CMD_WP);
}